

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::getFormattedDuration_abi_cxx11_(double duration)

{
  string *in_RDI;
  undefined8 in_XMM0_Qa;
  ErrnoGuard guard;
  char buffer [314];
  size_t maxDoubleSize;
  allocator<char> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  
  ErrnoGuard::ErrnoGuard((ErrnoGuard *)in_RDI);
  sprintf(&stack0xfffffffffffffea8,"%.3f",in_XMM0_Qa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea3);
  ErrnoGuard::~ErrnoGuard((ErrnoGuard *)in_RDI);
  return in_RDI;
}

Assistant:

std::string getFormattedDuration( double duration ) {
        // Max exponent + 1 is required to represent the whole part
        // + 1 for decimal point
        // + 3 for the 3 decimal places
        // + 1 for null terminator
        const std::size_t maxDoubleSize = DBL_MAX_10_EXP + 1 + 1 + 3 + 1;
        char buffer[maxDoubleSize];

        // Save previous errno, to prevent sprintf from overwriting it
        ErrnoGuard guard;
#ifdef _MSC_VER
        sprintf_s(buffer, "%.3f", duration);
#else
        std::sprintf(buffer, "%.3f", duration);
#endif
        return std::string(buffer);
    }